

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

void __thiscall
amrex::CoordSys::GetCellVolCoord
          (CoordSys *this,Vector<double,_std::allocator<double>_> *vc,Box *region,int dir)

{
  int in_stack_0000002c;
  Box *in_stack_00000030;
  Vector<double,_std::allocator<double>_> *in_stack_00000038;
  CoordSys *in_stack_00000040;
  
  GetCellLoc(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
  return;
}

Assistant:

void
CoordSys::GetCellVolCoord (Vector<Real>& vc,
                           const Box&   region,
                           int          dir) const
{
    //
    // In cartesian and Z direction of RZ volume coordinates
    // are identical to physical distance from axis.
    //
    GetCellLoc(vc,region,dir);
    //
    // In R direction of RZ, vol coord = (r^2)/2.
    //
#if (AMREX_SPACEDIM == 2)
    if (dir == 0 && c_sys == RZ)
    {
        int len = vc.size();
        AMREX_PRAGMA_SIMD
        for (int i = 0; i < len; i++)
        {
            Real r = vc[i];
            vc[i] = 0.5_rt*r*r;
        }
    }
#elif (AMREX_SPACEDIM == 1)
    if (c_sys == SPHERICAL) {
        int len = vc.size();
        AMREX_PRAGMA_SIMD
        for (int i = 0; i < len; i++) {
            Real r = vc[i];
            vc[i] = static_cast<Real>(FOURPI/3.)*r*r*r;
        }
    }
#endif
}